

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration.c
# Opt level: O0

int scep_conf_load_operation_getcrl(CONF *conf)

{
  char *pcVar1;
  char *var;
  CONF *conf_local;
  
  pcVar1 = NCONF_get_string((CONF *)conf,"sscep_getcrl","PrivateKeyFile");
  if ((pcVar1 != (char *)0x0) && (k_flag == 0)) {
    k_flag = 1;
    k_char = strdup(pcVar1);
    if (k_char == (char *)0x0) {
      error_memory();
    }
  }
  pcVar1 = NCONF_get_string((CONF *)conf,"sscep_getcrl","LocalCertFile");
  if ((pcVar1 != (char *)0x0) && (l_flag == 0)) {
    l_flag = 1;
    l_char = strdup(pcVar1);
    if (l_char == (char *)0x0) {
      error_memory();
    }
  }
  pcVar1 = NCONF_get_string((CONF *)conf,"sscep_getcert","GetCertSerial");
  if ((pcVar1 != (char *)0x0) && (s_flag == 0)) {
    s_flag = 1;
    s_char = strdup(pcVar1);
    if (s_char == (char *)0x0) {
      error_memory();
    }
  }
  pcVar1 = NCONF_get_string((CONF *)conf,"sscep_getcrl","GetCrlFile");
  if ((pcVar1 != (char *)0x0) && (w_flag == 0)) {
    w_flag = 1;
    w_char = strdup(pcVar1);
    if (w_char == (char *)0x0) {
      error_memory();
    }
  }
  pcVar1 = NCONF_get_string((CONF *)conf,"sscep_enroll","SignCertFile");
  if ((pcVar1 != (char *)0x0) && (O_flag == 0)) {
    O_flag = 1;
    O_char = strdup(pcVar1);
    if (O_char == (char *)0x0) {
      error_memory();
    }
  }
  return 0;
}

Assistant:

int scep_conf_load_operation_getcrl(CONF *conf) {
	char *var;
	if((var = NCONF_get_string(conf, SCEP_CONFIGURATION_SECTION_GETCRL, SCEP_CONFIGURATION_PARAM_PRIVATEKEYFILE)) && !k_flag) {
		k_flag = 1;
		if(!(k_char = strdup(var)))
			error_memory();
	}

	if((var = NCONF_get_string(conf, SCEP_CONFIGURATION_SECTION_GETCRL, SCEP_CONFIGURATION_PARAM_LOCALCERTFILE)) && !l_flag) {
		l_flag = 1;
		if(!(l_char = strdup(var)))
			error_memory();
	}

	if((var = NCONF_get_string(conf, SCEP_CONFIGURATION_SECTION_GETCERT, SCEP_CONFIGURATION_PARAM_GETCERTSERIAL)) && !s_flag) {
		s_flag = 1;
		if(!(s_char = strdup(var)))
			error_memory();
	}

	if((var = NCONF_get_string(conf, SCEP_CONFIGURATION_SECTION_GETCRL, SCEP_CONFIGURATION_PARAM_GETCRLFILE)) && !w_flag) {
		w_flag = 1;
		if(!(w_char = strdup(var)))
			error_memory();
	}

	if((var = NCONF_get_string(conf, SCEP_CONFIGURATION_SECTION_ENROLL, SCEP_CONFIGURATION_PARAM_SIGNCERTFILE)) && !O_flag) {
		O_flag = 1;
		if(!(O_char = strdup(var)))
			error_memory();
	}

	return 0;
}